

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

void bcache_shutdown(void)

{
  list_elem *plVar1;
  uint uVar2;
  list_elem *e_00;
  hash *hash;
  int rv;
  fnamedic_item *fname;
  list_elem *e;
  bcache_item *item;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  avl_tree **in_stack_ffffffffffffffe8;
  
  pthread_spin_lock(&freelist_lock);
  e_00 = list_begin(&freelist);
  while (e_00 != (list_elem *)0x0) {
    plVar1 = e_00 + -3;
    e_00 = list_remove(&freelist,e_00);
    std::__atomic_base<unsigned_long>::operator--
              (&freelist_count.super___atomic_base<unsigned_long>,0);
    free(&plVar1->next);
  }
  pthread_spin_unlock(&freelist_lock);
  writer_lock((fdb_rw_lock *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  hash = (hash *)list_begin(&file_zombies);
  while (hash != (hash *)0x0) {
    in_stack_ffffffffffffffe8 = &hash[-1].buckets;
    hash = (hash *)list_remove(&file_zombies,(list_elem *)hash);
    _fname_free((fnamedic_item *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  free(file_list);
  writer_unlock((fdb_rw_lock *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  free(buffercache_addr);
  pthread_spin_lock(&bcache_lock);
  hash_free_active(hash,(hash_free_func *)in_stack_ffffffffffffffe8);
  pthread_spin_unlock(&bcache_lock);
  pthread_spin_destroy(&bcache_lock);
  pthread_spin_destroy(&freelist_lock);
  uVar2 = destroy_rw_lock((fdb_rw_lock *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (uVar2 != 0) {
    fprintf(_stderr,"Error in bcache_shutdown(): RW Lock\'s destruction failed; ErrorCode: %d\n",
            (ulong)uVar2);
  }
  return;
}

Assistant:

void bcache_shutdown()
{
    struct bcache_item *item;
    struct list_elem *e;

    spin_lock(&freelist_lock);
    e = list_begin(&freelist);
    while(e) {
        item = _get_entry(e, struct bcache_item, list_elem);
        e = list_remove(&freelist, e);
        freelist_count--;
        free(item);
    }
    spin_unlock(&freelist_lock);

    writer_lock(&filelist_lock);
    // Force clean zombies if any
    e = list_begin(&file_zombies);
    while (e) {
        struct fnamedic_item *fname = _get_entry(e, struct fnamedic_item, le);
        e = list_remove(&file_zombies, e);
        _fname_free(fname);
    }
    // Free the file list array
    free(file_list);
    writer_unlock(&filelist_lock);

    // Free entire buffercache memory
    free(buffercache_addr);

    spin_lock(&bcache_lock);
    hash_free_active(&fnamedic, _bcache_free_fnamedic);
    spin_unlock(&bcache_lock);

    spin_destroy(&bcache_lock);
    spin_destroy(&freelist_lock);

    int rv = destroy_rw_lock(&filelist_lock);
    if (rv != 0) {
        fprintf(stderr, "Error in bcache_shutdown(): "
                        "RW Lock's destruction failed; ErrorCode: %d\n", rv);
    }
}